

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# price_field_test.cpp
# Opt level: O2

void __thiscall
bidfx_public_api::price::pixie::PriceFieldTest_TestString_Test::~PriceFieldTest_TestString_Test
          (PriceFieldTest_TestString_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(PriceFieldTest, TestString)
{
    std::string value = "Hello, World!";
    PriceField field = PriceField(value);
    EXPECT_EQ(PriceField::STRING, field.GetType());
    EXPECT_EQ(value, field.GetString());
    EXPECT_THROW(field.GetInt(), std::logic_error);
    EXPECT_THROW(field.GetLong(), std::logic_error);
    EXPECT_THROW(field.GetDouble(), std::logic_error);
}